

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O0

void __thiscall QDBusMenuBar::unregisterMenuBar(QDBusMenuBar *this)

{
  QLatin1StringView latin1;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  QPlatformIntegration *pQVar7;
  undefined4 extraout_var;
  long *plVar8;
  QWindow *pQVar9;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar10;
  QDesktopUnixServices *unixServices;
  QDBusPendingReply<> r;
  QDBusMenuRegistrarInterface registrar;
  QDBusConnection connection;
  QString *in_stack_fffffffffffffe18;
  QDBusError *in_stack_fffffffffffffe20;
  QWindow *in_stack_fffffffffffffe28;
  QObject *in_stack_fffffffffffffe30;
  QDBusConnection *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  QDBusMenuRegistrarInterface *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffeac;
  QString local_140 [4];
  QString local_d0 [2];
  char local_a0 [32];
  undefined1 *local_80;
  undefined1 *local_48;
  undefined1 *local_40;
  QLatin1StringView local_38;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWindow> *)0xaed815);
  if (bVar1) {
    QGuiApplication::platformName();
    local_38 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
    bVar2 = ::operator==((QString *)in_stack_fffffffffffffe28,
                         (QLatin1StringView *)in_stack_fffffffffffffe20);
    QString::~QString((QString *)0xaed872);
    if ((bVar2 & 1) != 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
      QVar10.m_data = in_stack_fffffffffffffe58;
      QVar10.m_size = (qsizetype)in_stack_fffffffffffffe50;
      QString::QString((QString *)in_stack_fffffffffffffe30,QVar10);
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
      latin1.m_data = (char *)QVar10.m_size;
      latin1.m_size = (qsizetype)in_stack_fffffffffffffe50;
      QString::QString((QString *)in_stack_fffffffffffffe30,latin1);
      QDBusMenuRegistrarInterface::QDBusMenuRegistrarInterface
                (in_stack_fffffffffffffe50,in_RDI,
                 (QString *)CONCAT17(bVar2,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe30);
      QString::~QString((QString *)0xaed938);
      QString::~QString((QString *)0xaed945);
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWindow>::operator->((QPointer<QWindow> *)0xaed962);
      QWindow::winId(in_stack_fffffffffffffe28);
      QDBusMenuRegistrarInterface::UnregisterWindow
                ((QDBusMenuRegistrarInterface *)in_RDI,in_stack_fffffffffffffeac);
      QDBusPendingCall::waitForFinished();
      uVar4 = QDBusPendingCall::isError();
      if ((uVar4 & 1) != 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                   (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),(char *)in_stack_fffffffffffffe18
                  );
        QDBusPendingCall::error();
        QDBusError::name();
        QtPrivate::asString(local_d0);
        QString::toUtf8(in_stack_fffffffffffffe18);
        pcVar5 = QByteArray::constData((QByteArray *)0xaeda0e);
        QDBusPendingCall::error();
        QDBusError::message();
        QtPrivate::asString(local_140);
        QString::toUtf8(in_stack_fffffffffffffe18);
        pcVar6 = QByteArray::constData((QByteArray *)0xaeda61);
        QMessageLogger::warning
                  (local_a0,"Failed to unregister window menu, reason: %s (\"%s\")",pcVar5,pcVar6);
        QByteArray::~QByteArray((QByteArray *)0xaeda8c);
        QString::~QString((QString *)0xaeda99);
        QDBusError::~QDBusError(in_stack_fffffffffffffe20);
        QByteArray::~QByteArray((QByteArray *)0xaedab0);
        QString::~QString((QString *)0xaedabd);
        QDBusError::~QDBusError(in_stack_fffffffffffffe20);
      }
      QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0xaedad7);
      QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)0xaedae4);
    }
    pQVar7 = QGuiApplicationPrivate::platformIntegration();
    iVar3 = (*pQVar7->_vptr_QPlatformIntegration[0x13])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      plVar8 = (long *)0x0;
    }
    else {
      plVar8 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar3),&QPlatformServices::typeinfo,
                                      &QDesktopUnixServices::typeinfo,0);
    }
    pQVar9 = ::QPointer::operator_cast_to_QWindow_((QPointer<QWindow> *)0xaedb4e);
    (**(code **)(*plVar8 + 0x48))(plVar8,pQVar9);
  }
  bVar1 = QString::isEmpty((QString *)0xaedb6a);
  if (!bVar1) {
    QDBusConnection::unregisterObject(&local_10,&in_RDI[2].d.ptr,0);
  }
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusMenuBar::unregisterMenuBar()
{
    QDBusConnection connection = QDBusConnection::sessionBus();

    if (m_window) {
        if (QGuiApplication::platformName() == "xcb"_L1) {
            QDBusMenuRegistrarInterface registrar(REGISTRAR_SERVICE, REGISTRAR_PATH, connection, this);
            QDBusPendingReply<> r = registrar.UnregisterWindow(m_window->winId());
            r.waitForFinished();
            if (r.isError())
                qWarning("Failed to unregister window menu, reason: %s (\"%s\")",
                         qUtf8Printable(r.error().name()), qUtf8Printable(r.error().message()));
        }

        const auto unixServices = dynamic_cast<QDesktopUnixServices *>(
            QGuiApplicationPrivate::platformIntegration()->services());
        unixServices->unregisterDBusMenuForWindow(m_window);
    }

    if (!m_objectPath.isEmpty()) {
        connection.unregisterObject(m_objectPath);
    }
}